

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

bool __thiscall libcellml::Component::removeVariable(Component *this,VariablePtr *variable)

{
  bool bVar1;
  ComponentImpl *pCVar2;
  element_type *this_00;
  VariableImpl *this_01;
  __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
  local_28;
  const_iterator result;
  VariablePtr *variable_local;
  Component *this_local;
  
  result._M_current = variable;
  pCVar2 = pFunc(this);
  local_28._M_current =
       (shared_ptr<libcellml::Variable> *)ComponentImpl::findVariable(pCVar2,result._M_current);
  pCVar2 = pFunc(this);
  local_30._M_current =
       (shared_ptr<libcellml::Variable> *)
       std::
       vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
       ::end(&pCVar2->mVariables);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar1) {
    pCVar2 = pFunc(this);
    std::
    vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
    ::erase(&pCVar2->mVariables,(const_iterator)local_28._M_current);
    this_00 = std::
              __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)result._M_current);
    this_01 = Variable::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_01);
  }
  return bVar1;
}

Assistant:

bool Component::removeVariable(const VariablePtr &variable)
{
    auto result = pFunc()->findVariable(variable);
    if (result != pFunc()->mVariables.end()) {
        pFunc()->mVariables.erase(result);
        variable->pFunc()->removeParent();
        return true;
    }

    return false;
}